

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,string *name)

{
  pointer pcVar1;
  
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

TestCaseFilters( const std::string& name ) : m_name( name ) {}